

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::render
          (QGraphicsScene *this,QPainter *painter,QRectF *target,QRectF *source,
          AspectRatioMode aspectRatioMode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  double *pdVar7;
  ulong uVar8;
  void *pvVar9;
  const_reference ppQVar10;
  QTransform *pQVar11;
  ulong uVar12;
  ulong *puVar13;
  QGraphicsItemPrivate *pQVar14;
  qreal *in_RCX;
  qreal *in_RDX;
  QRectF *in_RSI;
  long *in_RDI;
  ulong uVar15;
  int in_R8D;
  long in_FS_OFFSET;
  qreal qVar16;
  qreal qVar17;
  qsizetype i_1;
  QStyleOptionGraphicsItem *styleOptionArray;
  qsizetype i;
  qsizetype numItems;
  QGraphicsItem **itemArray;
  QList<QGraphicsItem_*> itemList;
  qreal yratio;
  qreal xratio;
  QRectF targetRect;
  QRectF sourceRect;
  QTransform painterTransform;
  qsizetype in_stack_fffffffffffffd58;
  QTransform *in_stack_fffffffffffffd60;
  qreal *pqVar18;
  QTransform *in_stack_fffffffffffffd70;
  QGraphicsScene *in_stack_fffffffffffffd78;
  QRectF *in_stack_fffffffffffffd80;
  qreal *pqVar19;
  QRectF *in_stack_fffffffffffffd88;
  undefined1 allItems;
  qreal *in_stack_fffffffffffffda0;
  QStyleOptionGraphicsItem *in_stack_fffffffffffffda8;
  QGraphicsItemPrivate *in_stack_fffffffffffffdb0;
  long local_1e8;
  long local_1d8;
  QRect local_198;
  QRegion local_188;
  QList<QGraphicsItem_*> local_180;
  double local_168;
  double local_160;
  QRectF local_158;
  qreal local_138;
  qreal local_130;
  qreal local_128;
  qreal local_120;
  QRectF local_118 [3];
  QTransform local_a8 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_118[0].xp = *in_RCX;
  local_118[0].yp = in_RCX[1];
  local_118[0].w = in_RCX[2];
  local_118[0].h = in_RCX[3];
  bVar3 = QRectF::isNull(local_118);
  if (bVar3) {
    sceneRect(in_stack_fffffffffffffd78);
    local_118[0].xp = local_138;
    local_118[0].yp = local_130;
    local_118[0].w = local_128;
    local_118[0].h = local_120;
  }
  local_158.xp = *in_RDX;
  local_158.yp = in_RDX[1];
  local_158.w = in_RDX[2];
  local_158.h = in_RDX[3];
  bVar3 = QRectF::isNull(&local_158);
  if (bVar3) {
    plVar6 = (long *)QPainter::device();
    iVar4 = (**(code **)(*plVar6 + 0x10))();
    if (iVar4 == 5) {
      local_158.xp = local_118[0].xp;
      local_158.yp = local_118[0].yp;
      local_158.w = local_118[0].w;
      local_158.h = local_118[0].h;
    }
    else {
      QPainter::device();
      iVar4 = QPaintDevice::width((QPaintDevice *)0x9c9f8a);
      QPainter::device();
      iVar5 = QPaintDevice::height((QPaintDevice *)0x9c9fac);
      QRectF::setRect(&local_158,0.0,0.0,(double)iVar4,(double)iVar5);
    }
  }
  qVar16 = QRectF::width(&local_158);
  qVar17 = QRectF::width(local_118);
  local_160 = qVar16 / qVar17;
  qVar16 = QRectF::height(&local_158);
  qVar17 = QRectF::height(local_118);
  local_168 = qVar16 / qVar17;
  if (in_R8D != 0) {
    if (in_R8D == 1) {
      pdVar7 = qMin<double>(&local_160,&local_168);
      local_168 = *pdVar7;
      local_160 = local_168;
    }
    else if (in_R8D == 2) {
      pdVar7 = qMax<double>(&local_160,&local_168);
      local_168 = *pdVar7;
      local_160 = local_168;
    }
  }
  local_180.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_180.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_180.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QTransform::QTransform(in_stack_fffffffffffffd60);
  items((QGraphicsScene *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
        (ItemSelectionMode)((ulong)in_stack_fffffffffffffd78 >> 0x20),
        (SortOrder)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  uVar8 = QList<QGraphicsItem_*>::size(&local_180);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  uVar8 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  uVar8 = QList<QGraphicsItem_*>::size(&local_180);
  for (local_1d8 = 0; local_1d8 < (long)uVar8; local_1d8 = local_1d8 + 1) {
    ppQVar10 = QList<QGraphicsItem_*>::at
                         ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffd60,
                          in_stack_fffffffffffffd58);
    *(QGraphicsItem **)((long)pvVar9 + ((uVar8 - local_1d8) + -1) * 8) = *ppQVar10;
  }
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)in_stack_fffffffffffffd60);
  QPainter::save();
  QPainter::setClipRect(in_RSI,(ClipOperation)&local_158);
  memcpy(local_a8,&DAT_00b44bd0,0x50);
  QTransform::QTransform(in_stack_fffffffffffffd60);
  QTransform::QTransform(in_stack_fffffffffffffd60);
  qVar16 = QRectF::left(&local_158);
  qVar17 = QRectF::top(&local_158);
  QTransform::translate(qVar16,qVar17);
  QTransform::scale(local_160,local_168);
  qVar16 = QRectF::left(local_118);
  qVar17 = QRectF::top(local_118);
  pQVar11 = (QTransform *)QTransform::translate(-qVar16,-qVar17);
  QTransform::operator*=(local_a8,pQVar11);
  QPainter::setWorldTransform((QTransform *)in_RSI,SUB81(local_a8,0));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar12 = SUB168(auVar2 * ZEXT816(0x60),0);
  uVar15 = uVar12 + 8;
  if (SUB168(auVar2 * ZEXT816(0x60),8) != 0 || 0xfffffffffffffff7 < uVar12) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar13 = (ulong *)operator_new__(uVar15);
  *puVar13 = uVar8;
  pqVar19 = (qreal *)(puVar13 + 1);
  if (uVar8 != 0) {
    in_stack_fffffffffffffda8 = (QStyleOptionGraphicsItem *)(pqVar19 + uVar8 * 0xc);
    in_stack_fffffffffffffdb0 = (QGraphicsItemPrivate *)pqVar19;
    do {
      in_stack_fffffffffffffda0 = (qreal *)in_stack_fffffffffffffdb0;
      QStyleOptionGraphicsItem::QStyleOptionGraphicsItem((QStyleOptionGraphicsItem *)0x9ca3ce);
      in_stack_fffffffffffffdb0 =
           (QGraphicsItemPrivate *)
           (((QTransform *)(in_stack_fffffffffffffda0 + 10))->m_matrix[0] + 2);
    } while (in_stack_fffffffffffffdb0 != (QGraphicsItemPrivate *)in_stack_fffffffffffffda8);
  }
  for (local_1e8 = 0; local_1e8 < (long)uVar8; local_1e8 = local_1e8 + 1) {
    pQVar14 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
              operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                          *)(*(long *)((long)pvVar9 + local_1e8 * 8) + 8));
    allItems = (undefined1)((ulong)pQVar14 >> 0x38);
    pqVar18 = pqVar19 + local_1e8 * 0xc;
    local_198 = QRectF::toRect(in_stack_fffffffffffffd88);
    QRegion::QRegion(&local_188,(QRect *)&local_198,Rectangle);
    QGraphicsItemPrivate::initStyleOption
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (QTransform *)in_stack_fffffffffffffda0,(QRegion *)pqVar18,(bool)allItems);
    QRegion::~QRegion(&local_188);
  }
  (**(code **)(*in_RDI + 0xe8))(in_RDI,in_RSI,local_118);
  (**(code **)(*in_RDI + 0xf8))(in_RDI,in_RSI,uVar8 & 0xffffffff,pvVar9,pqVar19,0);
  (**(code **)(*in_RDI + 0xf0))(in_RDI,in_RSI,local_118);
  if (pvVar9 != (void *)0x0) {
    operator_delete__(pvVar9);
  }
  if (pqVar19 != (qreal *)0x0) {
    uVar8 = *puVar13;
    pqVar18 = pqVar19 + uVar8 * 0xc;
    if (pqVar19 != pqVar18) {
      do {
        pqVar18 = pqVar18 + -0xc;
        QStyleOptionGraphicsItem::~QStyleOptionGraphicsItem((QStyleOptionGraphicsItem *)0x9ca5b8);
      } while (pqVar18 != pqVar19);
    }
    operator_delete__(puVar13,uVar8 * 0x60 + 8);
  }
  QPainter::restore();
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9ca5fd);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::render(QPainter *painter, const QRectF &target, const QRectF &source,
                            Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    // Default source rect = scene rect
    QRectF sourceRect = source;
    if (sourceRect.isNull())
        sourceRect = sceneRect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (targetRect.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QList<QGraphicsItem *> itemList = items(sourceRect, Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    const qsizetype numItems = itemList.size();
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    painter->save();

    // Transform the painter.
    painter->setClipRect(targetRect, Qt::IntersectClip);
    QTransform painterTransform;
    painterTransform *= QTransform()
                        .translate(targetRect.left(), targetRect.top())
                        .scale(xratio, yratio)
                        .translate(-sourceRect.left(), -sourceRect.top());
    painter->setWorldTransform(painterTransform, true);

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = new QStyleOptionGraphicsItem[numItems];
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterTransform, targetRect.toRect());

    // Render the scene.
    drawBackground(painter, sourceRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceRect);

    delete [] itemArray;
    delete [] styleOptionArray;

    painter->restore();
}